

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Minefield_Data_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Data_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference puVar3;
  pointer pMVar4;
  string local_2b0 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
  local_290;
  const_iterator citrMnEnd;
  const_iterator citrMn;
  const_iterator citrStEnd;
  const_iterator citrSt;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Minefield_Data_PDU *local_18;
  Minefield_Data_PDU *this_local;
  
  local_18 = this;
  this_local = (Minefield_Data_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Minefield Data PDU-\n");
  Minefield_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_Minefield_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Requesting ID: ");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_ReqID);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Minefield Sequence Number: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_SeqNumUnion).m_ui16SeqNum);
  poVar2 = std::operator<<(poVar2,"Request ID: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8ReqID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"PDU Sequence Number: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8PduSeqNum);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of PDU\'s: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumPdus);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Mines: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumMines);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Sensor Types: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumSensTyp);
  poVar2 = std::operator<<(poVar2,"\n");
  DATA_TYPE::MinefieldDataFilter::GetAsString_abi_cxx11_(&local_250,&this->m_DataFilter);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Mine Type: ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_((KString *)&citrSt,&this->m_MineTyp);
  poVar2 = std::operator<<(poVar2,(string *)&citrSt);
  std::operator<<(poVar2,"Sensor Types:\n");
  std::__cxx11::string::~string((string *)&citrSt);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrStEnd = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                        (&this->m_vui16SensorTypes);
  citrMn._M_current =
       (Mine *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                         (&this->m_vui16SensorTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&citrStEnd,
                       (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)&citrMn);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"\t");
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrStEnd);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*puVar3);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrStEnd);
  }
  std::operator<<(local_190,"Mines:\n");
  citrMnEnd = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::begin
                        (&this->m_vMines);
  local_290._M_current =
       (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                         (&this->m_vMines);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrMnEnd,&local_290);
    if (!bVar1) break;
    pMVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
             ::operator->(&citrMnEnd);
    (*(pMVar4->super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase[2])(local_2b0);
    std::operator<<(local_190,local_2b0);
    std::__cxx11::string::~string(local_2b0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Data_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield Data PDU-\n"
       << Minefield_Header::GetAsString()
       << "Requesting ID: "             << IndentString( m_ReqID.GetAsString(), 1 )
       << "Minefield Sequence Number: " << m_SeqNumUnion.m_ui16SeqNum
       << "Request ID: "                << ( KUINT16 )m_ui8ReqID        << "\n"
       << "PDU Sequence Number: "       << ( KUINT16 )m_ui8PduSeqNum    << "\n"
       << "Number Of PDU's: "           << ( KUINT16 )m_ui8NumPdus      << "\n"
       << "Number Of Mines: "           << ( KUINT16 )m_ui8NumMines     << "\n"
       << "Number Of Sensor Types: "    << ( KUINT16 )m_ui8NumSensTyp   << "\n"
       << m_DataFilter.GetAsString()
       << "Mine Type: " << m_MineTyp.GetAsString()
       << "Sensor Types:\n";

    // Sensor Types
    vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    vector<KUINT16>::const_iterator citrStEnd = m_vui16SensorTypes.end();
    for( ; citrSt != citrStEnd; ++citrSt )
    {
        ss <<  "\t" << *citrSt << "\n";
    }

    ss << "Mines:\n";

    vector<Mine>::const_iterator citrMn = m_vMines.begin();
    vector<Mine>::const_iterator citrMnEnd = m_vMines.end();
    for( ; citrMn != citrMnEnd; ++citrMn )
    {
        ss << citrMn->GetAsString();
    }

    return ss.str();
}